

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::Client(Client *this,string *alias)

{
  string *alias_local;
  Client *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->terminate_client = false;
  this->send_to_server = false;
  this->rcv_from_server = false;
  this->client_rcv = false;
  memcpy(this->buffer,"",0x100);
  Message::Message(&this->msg_for_server);
  Message::Message(&this->msg_from_server);
  std::__cxx11::string::operator=((string *)this,(string *)alias);
  return;
}

Assistant:

Client::Client(std::string alias)
{
    name = alias;
}